

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O3

void __thiscall
QWidgetRepaintManager::markDirty<QRegion>
          (QWidgetRepaintManager *this,QRegion *r,QWidget *widget,UpdateTime updateTime,
          BufferState bufferState)

{
  QWidgetRepaintManager *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  QWidgetRepaintManager QVar3;
  QWidgetData *pQVar4;
  long lVar5;
  QWidgetPrivate *this_01;
  Representation RVar6;
  undefined1 auVar7 [12];
  QRect QVar8;
  bool bVar9;
  char cVar10;
  byte bVar11;
  QLoggingCategory *pQVar12;
  QPoint QVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  QRegion *this_02;
  long lVar17;
  long in_FS_OFFSET;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  undefined1 auVar22 [16];
  QRect QVar23;
  QRect local_c8;
  QRect local_b8;
  QRect local_a8;
  QRegion local_98;
  undefined1 local_90 [16];
  QDebug local_80;
  QArrayData *local_78;
  QWidgetData *pQStack_70;
  double local_68;
  double local_60;
  QRect local_58;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar12 = QtPrivateLogging::lcWidgetPainting();
  if (((pQVar12->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
    local_40 = pQVar12->name;
    local_58.x1.m_i = 2;
    local_58.y1.m_i = 0;
    local_58.x2.m_i = 0;
    local_58.y2.m_i = 0;
    uStack_48 = 0;
    local_44 = 0;
    QMessageLogger::info();
    uVar1 = local_c8._0_8_;
    QVar18.m_data = (storage_type *)0x7;
    QVar18.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar18);
    QTextStream::operator<<((QTextStream *)uVar1,(QString *)&local_78);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_c8._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_c8._0_8_,' ');
    }
    local_98.d = (QRegionData *)local_c8._0_8_;
    *(int *)(local_c8._0_8_ + 0x28) = *(int *)(local_c8._0_8_ + 0x28) + 1;
    ::operator<<((Stream *)&local_b8,&local_98);
    uVar1 = local_b8._0_8_;
    QVar19.m_data = (storage_type *)0x2;
    QVar19.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar19);
    QTextStream::operator<<((QTextStream *)uVar1,(QString *)&local_78);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_b8._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8._0_8_,' ');
    }
    local_90._0_4_ = local_b8.x1.m_i;
    local_90._4_4_ = local_b8.y1.m_i;
    *(int *)(local_b8._0_8_ + 0x28) = *(int *)(local_b8._0_8_ + 0x28) + 1;
    ::operator<<((Stream *)&local_a8,(QWidget *)local_90);
    uVar1 = local_a8._0_8_;
    QVar20.m_data = (storage_type *)0x5;
    QVar20.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar20);
    QTextStream::operator<<((QTextStream *)uVar1,(QString *)&local_78);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_a8._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_a8._0_8_,' ');
    }
    uVar1 = local_a8._0_8_;
    QVar21.m_data = (storage_type *)0x4;
    QVar21.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar21);
    QTextStream::operator<<((QTextStream *)uVar1,(QString *)&local_78);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_a8._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_a8._0_8_,' ');
    }
    *(int *)(local_a8._0_8_ + 0x28) = *(int *)(local_a8._0_8_ + 0x28) + 1;
    qt_QMetaEnum_debugOperator
              (&local_80,(longlong)(local_90 + 8),(QMetaObject *)(ulong)updateTime,
               (char *)&staticMetaObject);
    QDebug::~QDebug(&local_80);
    QDebug::~QDebug((QDebug *)(local_90 + 8));
    QDebug::~QDebug((QDebug *)&local_a8);
    QDebug::~QDebug((QDebug *)local_90);
    QDebug::~QDebug((QDebug *)&local_b8);
    QDebug::~QDebug((QDebug *)&local_98);
    QDebug::~QDebug((QDebug *)&local_c8);
  }
  QWidgetPrivate::invalidateGraphicsEffectsRecursively(*(QWidgetPrivate **)&widget->field_0x8);
  pQVar4 = widget->data;
  uVar15 = (pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i;
  iVar16 = (pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i;
  lVar17 = CONCAT44(iVar16,uVar15);
  local_a8.x1.m_i = 0;
  local_a8.y1.m_i = 0;
  local_a8._8_8_ = lVar17;
  bVar9 = QWidgetPrivate::shouldPaintOnScreen(*(QWidgetPrivate **)&widget->field_0x8);
  lVar5 = *(long *)&widget->field_0x8;
  if (bVar9) {
    cVar10 = QRegion::isEmpty();
    this_02 = (QRegion *)(*(long *)&widget->field_0x8 + 0xe0);
    if (cVar10 == '\0') {
      cVar10 = qt_region_strictContains(this_02,&local_a8);
      QVar23.x2.m_i = local_c8.x2.m_i;
      QVar23.y2.m_i = local_c8.y2.m_i;
      QVar23.x1.m_i = local_c8.x1.m_i;
      QVar23.y1.m_i = local_c8.y1.m_i;
      if (cVar10 == '\0') {
        cVar10 = QRegion::isEmpty();
        QRegion::operator+=((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),r);
        QVar8.x2.m_i = local_c8.x2.m_i;
        QVar8.y2.m_i = local_c8.y2.m_i;
        QVar8.x1.m_i = local_c8.x1.m_i;
        QVar8.y1.m_i = local_c8.y1.m_i;
        if ((updateTime != UpdateNow) && (local_c8 = QVar8, cVar10 == '\0')) goto LAB_0031db6c;
      }
      else {
        local_c8 = QVar23;
        if (updateTime != UpdateNow) goto LAB_0031db6c;
        updateTime = UpdateNow;
      }
    }
    else {
      QRegion::operator=(this_02,r);
    }
  }
  else if ((*(uint *)(lVar5 + 0x250) >> 0x18 & 1) == 0) {
    if ((*(QGraphicsEffect **)(lVar5 + 200) == (QGraphicsEffect *)0x0) ||
       (bVar9 = QGraphicsEffect::isEnabled(*(QGraphicsEffect **)(lVar5 + 200)), !bVar9)) {
      auVar7._4_8_ = 0;
      auVar7._0_4_ = uVar15;
      auVar7 = auVar7 << 0x40;
    }
    else {
      local_68 = (double)((long)(int)uVar15 + 1);
      local_78 = (QArrayData *)0x0;
      pQStack_70 = (QWidgetData *)0x0;
      local_60 = (double)((long)iVar16 + 1);
      (**(code **)(**(long **)(lVar5 + 200) + 0x60))(&local_58);
      auVar22 = QRectF::toAlignedRect();
      auVar7 = auVar22._0_12_;
      lVar17 = auVar22._8_8_;
    }
    local_58.x1.m_i = 0;
    local_58.y1.m_i = 0;
    local_b8._0_8_ = auVar7._0_8_;
    local_b8._8_8_ = lVar17;
    QVar13 = QWidget::mapTo(widget,*(QWidget **)this,(QPoint *)&local_58);
    RVar6 = QVar13.xp.m_i;
    uVar14 = (ulong)QVar13 & 0xffffffff00000000;
    local_c8._0_8_ =
         (ulong)(uint)(auVar7._0_4_ + RVar6.m_i) |
         (ulong)(auVar7._0_8_ + uVar14) & 0xffffffff00000000;
    local_c8._8_8_ = (ulong)(uint)(auVar7._8_4_ + RVar6.m_i) | lVar17 + uVar14 & 0xffffffff00000000;
    local_58.x1.m_i = 0;
    local_58.y1.m_i = 0;
    uVar1 = *(undefined8 *)(*(long *)(*(long *)this + 0x20) + 0x1c);
    uVar2 = *(undefined8 *)(*(long *)(*(long *)this + 0x20) + 0x14);
    local_58.x2.m_i = (int)uVar1 - (int)uVar2;
    local_58.y2.m_i = (int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20);
    local_c8 = (QRect)QRect::operator&(&local_c8,&local_58);
    this_00 = this + 0x10;
    cVar10 = qt_region_strictContains((QRegion *)this_00,&local_c8);
    if (cVar10 == '\0') {
      if (bufferState == BufferInvalid) {
        bVar11 = QRegion::isEmpty();
        QVar3 = this[0x88];
        lVar17 = *(long *)&widget->field_0x8;
        if (*(long *)(lVar17 + 200) == 0) {
          QRegion::translated((int)&local_58,(int)r);
          QRegion::operator+=((QRegion *)this_00,(QRegion *)&local_58);
          QRegion::~QRegion((QRegion *)&local_58);
        }
        else {
          auVar22 = QRegion::boundingRect();
          if (*(QGraphicsEffect **)(lVar17 + 200) != (QGraphicsEffect *)0x0) {
            bVar9 = QGraphicsEffect::isEnabled(*(QGraphicsEffect **)(lVar17 + 200));
            if (bVar9) {
              local_78 = (QArrayData *)(double)auVar22._0_4_;
              pQStack_70 = (QWidgetData *)(double)auVar22._4_4_;
              local_68 = (double)(((long)auVar22._8_4_ - (long)auVar22._0_4_) + 1);
              local_60 = (double)(((auVar22._8_8_ >> 0x20) - (auVar22._0_8_ >> 0x20)) + 1);
              (**(code **)(**(long **)(lVar17 + 200) + 0x60))(&local_58);
              auVar22 = QRectF::toAlignedRect();
            }
          }
          local_58.x1.m_i = auVar22._0_4_ + RVar6.m_i;
          local_58.x2.m_i = RVar6.m_i + auVar22._8_4_;
          local_58.y1.m_i = (int)(auVar22._0_8_ + uVar14 >> 0x20);
          local_58.y2.m_i = (int)(auVar22._8_8_ + uVar14 >> 0x20);
          QRegion::operator+=((QRegion *)this_00,&local_58);
        }
        if (updateTime != UpdateNow && (((byte)QVar3 ^ 1) & bVar11) == 0) goto LAB_0031db6c;
      }
      else if (*(long *)(this + 0x28) == 0) {
        addDirtyWidget(this,widget,r);
      }
      else {
        if ((*(byte *)(*(long *)&widget->field_0x8 + 0x252) & 8) == 0) {
          addDirtyWidget(this,widget,r);
        }
        else {
          cVar10 = qt_region_strictContains
                             ((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),&local_b8);
          if (cVar10 == '\0') {
            this_01 = *(QWidgetPrivate **)&widget->field_0x8;
            if (this_01->graphicsEffect == (QGraphicsEffect *)0x0) {
              QRegion::operator+=(&this_01->dirty,r);
            }
            else {
              QVar23 = QWidgetPrivate::effectiveRectFor(this_01,r);
              local_58.x1 = QVar23.x1.m_i;
              local_58.y1 = QVar23.y1.m_i;
              local_58.x2 = QVar23.x2.m_i;
              local_58.y2 = QVar23.y2.m_i;
              QRegion::operator+=((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),&local_58);
            }
          }
        }
        if (updateTime != UpdateNow) goto LAB_0031db6c;
        updateTime = UpdateNow;
      }
    }
    else {
      bVar9 = updateTime != UpdateNow;
      updateTime = UpdateNow;
      if (bVar9) goto LAB_0031db6c;
    }
    widget = *(QWidget **)this;
  }
  else {
    if ((*(uint *)(lVar5 + 0x250) >> 0x13 & 1) == 0) {
      addDirtyRenderToTextureWidget(this,widget);
    }
    if ((updateTime != UpdateNow) && (this[0x88] != (QWidgetRepaintManager)0x0)) goto LAB_0031db6c;
    widget = *(QWidget **)this;
  }
  sendUpdateRequest(this,widget,updateTime);
LAB_0031db6c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetRepaintManager::markDirty(const T &r, QWidget *widget, UpdateTime updateTime, BufferState bufferState)
{
    qCInfo(lcWidgetPainting) << "Marking" << r << "of" << widget << "dirty"
        << "with" << updateTime;

    Q_ASSERT(tlw->d_func()->extra);
    Q_ASSERT(tlw->d_func()->extra->topextra);
    Q_ASSERT(widget->isVisible() && widget->updatesEnabled());
    Q_ASSERT(widget->window() == tlw);
    Q_ASSERT(!r.isEmpty());

#if QT_CONFIG(graphicseffect)
    widget->d_func()->invalidateGraphicsEffectsRecursively();
#endif

    QRect widgetRect = widgetRectFor(widget, r);

    // ---------------------------------------------------------------------------

    if (widget->d_func()->shouldPaintOnScreen()) {
        if (widget->d_func()->dirty.isEmpty()) {
            widget->d_func()->dirty = r;
            sendUpdateRequest(widget, updateTime);
            return;
        } else if (qt_region_strictContains(widget->d_func()->dirty, widgetRect)) {
            if (updateTime == UpdateNow)
                sendUpdateRequest(widget, updateTime);
            return; // Already dirty
        }

        const bool eventAlreadyPosted = !widget->d_func()->dirty.isEmpty();
        widget->d_func()->dirty += r;
        if (!eventAlreadyPosted || updateTime == UpdateNow)
            sendUpdateRequest(widget, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (QWidgetPrivate::get(widget)->renderToTexture) {
        if (!widget->d_func()->inDirtyList)
            addDirtyRenderToTextureWidget(widget);
        if (!updateRequestSent || updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    QRect effectiveWidgetRect = widget->d_func()->effectiveRectFor(widgetRect);
    const QPoint offset = widget->mapTo(tlw, QPoint());
    QRect translatedRect = effectiveWidgetRect.translated(offset);
#if QT_CONFIG(graphicseffect)
    // Graphics effects may exceed window size, clamp
    translatedRect = translatedRect.intersected(QRect(QPoint(), tlw->size()));
#endif
    if (qt_region_strictContains(dirty, translatedRect)) {
        if (updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return; // Already dirty
    }

    // ---------------------------------------------------------------------------

    if (bufferState == BufferInvalid) {
        const bool eventAlreadyPosted = !dirty.isEmpty() || updateRequestSent;
#if QT_CONFIG(graphicseffect)
        if (widget->d_func()->graphicsEffect)
            dirty += widget->d_func()->effectiveRectFor(r).translated(offset);
        else
#endif
            dirty += r.translated(offset);

        if (!eventAlreadyPosted || updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (dirtyWidgets.isEmpty()) {
        addDirtyWidget(widget, r);
        sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (widget->d_func()->inDirtyList) {
        if (!qt_region_strictContains(widget->d_func()->dirty, effectiveWidgetRect)) {
#if QT_CONFIG(graphicseffect)
            if (widget->d_func()->graphicsEffect)
                widget->d_func()->dirty += widget->d_func()->effectiveRectFor(r);
            else
#endif
                widget->d_func()->dirty += r;
        }
    } else {
        addDirtyWidget(widget, r);
    }

    // ---------------------------------------------------------------------------

    if (updateTime == UpdateNow)
        sendUpdateRequest(tlw, updateTime);
}